

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_extractor.cpp
# Opt level: O0

bool __thiscall
r_exec::CTPX::build_requirement(CTPX *this,HLPBindingMap *bm,Code *m0,uint64_t period)

{
  P<r_exec::Fact> lhs;
  undefined2 uVar1;
  int iVar2;
  _Fact *p_Var3;
  Fact *o;
  Code *pCVar4;
  uint64_t uVar5;
  undefined4 extraout_var;
  long *plVar6;
  undefined4 extraout_var_00;
  HLPBindingMap *pHVar7;
  GuardBuilder *pGVar8;
  ModelBase *this_00;
  undefined8 uVar9;
  undefined8 extraout_RDX;
  P<r_code::Code> local_c0;
  P<r_code::Code> local_b8;
  undefined4 local_ac;
  Code *local_a8;
  Code *_m1;
  Code *_m0;
  P<r_exec::GuardBuilder> guard_builder;
  P<r_code::Code> m1;
  uint16_t write_index;
  P<r_exec::HLPBindingMap> _bm;
  _Fact *premise_pattern;
  Code *cst;
  Code *unpacked_cst;
  P<r_exec::Fact> local_50;
  P<r_exec::Fact> f_im0;
  _Fact *f_icst;
  Code *new_cst;
  uint64_t uStack_30;
  uint16_t premise_index;
  uint64_t period_local;
  Code *m0_local;
  HLPBindingMap *bm_local;
  CTPX *this_local;
  
  uStack_30 = period;
  period_local = (uint64_t)m0;
  m0_local = (Code *)bm;
  bm_local = (HLPBindingMap *)this;
  p_Var3 = core::P::operator_cast_to__Fact_((P *)&(this->super__TPX).super_TPX.target);
  f_im0.object = (_Object *)
                 _TPX::find_f_icst(&this->super__TPX,p_Var3,(uint16_t *)((long)&new_cst + 6),
                                   (Code **)&f_icst);
  if (f_im0.object == (_Object *)0x0) {
    this_local._7_1_ = 0;
    goto LAB_0028efd8;
  }
  uVar9 = 0;
  o = HLPBindingMap::build_f_ihlp
                ((HLPBindingMap *)m0_local,(Code *)period_local,Opcodes::IMdl,false);
  core::P<r_exec::Fact>::P(&local_50,o);
  pCVar4 = core::P::operator_cast_to_Code_((P *)&local_50);
  uVar5 = _Fact::get_after((_Fact *)f_im0.object);
  r_code::Utils::SetIndirectTimestamp<r_code::Code>(pCVar4,2,uVar5);
  pCVar4 = core::P::operator_cast_to_Code_((P *)&local_50);
  uVar5 = _Fact::get_before((_Fact *)f_im0.object);
  r_code::Utils::SetIndirectTimestamp<r_code::Code>(pCVar4,3,uVar5);
  if (f_icst == (_Fact *)0x0) {
    iVar2 = (*(f_im0.object)->_vptr__Object[9])(f_im0.object,0);
    plVar6 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x48))
                               ((long *)CONCAT44(extraout_var,iVar2),0);
    uVar1 = (**(code **)(*plVar6 + 0x50))();
    iVar2 = (int)CONCAT62((int6)((ulong)uVar9 >> 0x10),uVar1) + -1;
    cst = (Code *)(**(code **)(*plVar6 + 0x48))(plVar6,(short)iVar2,extraout_RDX,iVar2);
  }
  else {
    cst = (Code *)f_icst;
  }
  iVar2 = (*(cst->super__Object)._vptr__Object[9])(cst,(ulong)new_cst._6_2_);
  _bm.object = (_Object *)CONCAT44(extraout_var_00,iVar2);
  pHVar7 = (HLPBindingMap *)operator_new(0x40);
  HLPBindingMap::HLPBindingMap(pHVar7);
  core::P<r_exec::HLPBindingMap>::P((P<r_exec::HLPBindingMap> *)&stack0xffffffffffffff80,pHVar7);
  pHVar7 = core::P::operator_cast_to_HLPBindingMap_((P *)&stack0xffffffffffffff80);
  lhs = f_im0;
  p_Var3 = core::P::operator_cast_to__Fact_((P *)&local_50);
  pCVar4 = _TPX::build_mdl_head
                     (&this->super__TPX,pHVar7,0,(_Fact *)lhs.object,p_Var3,
                      (uint16_t *)((long)&m1.object + 6));
  core::P<r_code::Code>::P((P<r_code::Code> *)&guard_builder,pCVar4);
  pGVar8 = (GuardBuilder *)operator_new(0x10);
  GuardBuilder::GuardBuilder(pGVar8);
  core::P<r_exec::GuardBuilder>::P((P<r_exec::GuardBuilder> *)&_m0,pGVar8);
  pGVar8 = core::P<r_exec::GuardBuilder>::operator->((P<r_exec::GuardBuilder> *)&_m0);
  pCVar4 = core::P::operator_cast_to_Code_((P *)&guard_builder);
  (*(pGVar8->super__Object)._vptr__Object[2])
            (pGVar8,pCVar4,_bm.object,0,(undefined1 *)((long)&m1.object + 6));
  pCVar4 = core::P::operator_cast_to_Code_((P *)&guard_builder);
  _TPX::build_mdl_tail(&this->super__TPX,pCVar4,m1.object._6_2_);
  this_00 = ModelBase::Get();
  uVar5 = period_local;
  pCVar4 = core::P::operator_cast_to_Code_((P *)&guard_builder);
  ModelBase::check_existence(this_00,(Code *)uVar5,pCVar4,&_m1,&local_a8);
  if (local_a8 == (Code *)0x0) {
    this_local._7_1_ = 0;
  }
  else {
    pCVar4 = core::P::operator_cast_to_Code_((P *)&guard_builder);
    if (local_a8 == pCVar4) {
      if (_m1 == (Code *)0x0) {
        this_local._7_1_ = 0;
        goto LAB_0028ef80;
      }
      if (_m1 == (Code *)period_local) {
        core::P<r_code::Code>::P(&local_b8,(Code *)period_local);
        std::vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>::push_back
                  (&(this->super__TPX).mdls,&local_b8);
        core::P<r_code::Code>::~P(&local_b8);
      }
      if (f_icst != (_Fact *)0x0) {
        core::P<r_code::Code>::P(&local_c0,(Code *)f_icst);
        std::vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>::push_back
                  (&(this->super__TPX).csts,&local_c0);
        core::P<r_code::Code>::~P(&local_c0);
      }
      std::vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>::push_back
                (&(this->super__TPX).mdls,(value_type *)&guard_builder);
    }
    this_local._7_1_ = 1;
  }
LAB_0028ef80:
  local_ac = 1;
  core::P<r_exec::GuardBuilder>::~P((P<r_exec::GuardBuilder> *)&_m0);
  core::P<r_code::Code>::~P((P<r_code::Code> *)&guard_builder);
  core::P<r_exec::HLPBindingMap>::~P((P<r_exec::HLPBindingMap> *)&stack0xffffffffffffff80);
  core::P<r_exec::Fact>::~P(&local_50);
LAB_0028efd8:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CTPX::build_requirement(HLPBindingMap *bm, Code *m0, uint64_t period)   // check for mdl existence at the same time (ModelBase::mdlCS-wise).
{
    uint16_t premise_index;
    Code *new_cst;
    _Fact *f_icst = find_f_icst(target, premise_index, new_cst);

    if (f_icst == nullptr) { //std::cout<<Utils::RelativeTime(Now())<<" failed xxxxxxxxx M1 / 0\n";
        return false;
    }

    P<Fact> f_im0 = bm->build_f_ihlp(m0, Opcodes::IMdl, false);
    Utils::SetIndirectTimestamp<Code>(f_im0, FACT_AFTER, f_icst->get_after());
    Utils::SetIndirectTimestamp<Code>(f_im0, FACT_BEFORE, f_icst->get_before());
    Code *unpacked_cst;

    if (new_cst == nullptr) {
        Code *cst = f_icst->get_reference(0)->get_reference(0);
        unpacked_cst = cst->get_reference(cst->references_size() - CST_HIDDEN_REFS); // the cst is packed, retrieve the pattern from the unpacked code.
    } else {
        unpacked_cst = new_cst;
    }

    _Fact *premise_pattern = (_Fact *)unpacked_cst->get_reference(premise_index);
    P<HLPBindingMap> _bm = new HLPBindingMap();
    uint16_t write_index;
    P<Code> m1 = build_mdl_head(_bm, 0, f_icst, f_im0, write_index);
    P<GuardBuilder> guard_builder = new GuardBuilder();
    guard_builder->build(m1, premise_pattern, nullptr, write_index);
    build_mdl_tail(m1, write_index);
    Code *_m0;
    Code *_m1;
    ModelBase::Get()->check_existence(m0, m1, _m0, _m1);

    if (_m1 == nullptr) {
        return false;
    } else if (_m1 == m1) {
        if (_m0 == nullptr) {
            return false;
        } else if (_m0 == m0) {
            mdls.push_back(m0);
        }

        if (new_cst != nullptr) {
            csts.push_back(new_cst);
        }

        mdls.push_back(m1);
    } // if m1 alrady exists, new_cst==NULL.

    //std::cout<<Utils::RelativeTime(Now()<<" found --------------------- M1\n";
    return true;
}